

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O1

string * __thiscall
fakeit::MockImpl<IMessageHolder>::MethodMockingContextBase<unsigned_long>::getMethodName_abi_cxx11_
          (string *__return_storage_ptr__,MethodMockingContextBase<unsigned_long> *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(this->super_Context).super_Destructible._vptr_Destructible[9])(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x28);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,
             *(long *)(CONCAT44(extraout_var,iVar2) + 0x30) + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getMethodName() {
                return getRecordedMethodBody().getMethod().name();
            }